

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_fe.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
lf::fe::MeshFunctionFE<double,_double>::operator()
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          MeshFunctionFE<double,_double> *this,Entity *e,MatrixXd *local)

{
  Index *this_00;
  double dVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Index IVar4;
  reference peVar5;
  CoeffReturnType pdVar6;
  Scalar *pSVar7;
  size_type __n;
  double *dataPtr;
  undefined1 auVar8 [16];
  Product<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_c8;
  Stride<0,_0> local_b2;
  undefined1 local_b0 [8];
  Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> temp;
  size_type local_88;
  Index i;
  span<const_long,_18446744073709551615UL> global_dofs;
  Index local_60;
  int local_54;
  undefined1 local_50 [8];
  Matrix<double,_1,__1,_1,_1,__1> local_dofs;
  Matrix<double,__1,__1,_0,__1,__1> sf_eval;
  MatrixXd *local_local;
  Entity *e_local;
  MeshFunctionFE<double,_double> *this_local;
  vector<double,_std::allocator<double>_> *result;
  
  peVar3 = std::
           __shared_ptr_access<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  iVar2 = (*peVar3->_vptr_ScalarFESpace[2])(peVar3,e);
  this_00 = &local_dofs.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
             m_cols;
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x38))
            (this_00,(long *)CONCAT44(extraout_var,iVar2),local);
  local_54 = 1;
  local_60 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                       ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00);
  Eigen::Matrix<double,1,-1,1,1,-1>::Matrix<int,long>
            ((Matrix<double,1,_1,1,1,_1> *)local_50,&local_54,&local_60);
  peVar3 = std::
           __shared_ptr_access<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  iVar2 = (*peVar3->_vptr_ScalarFESpace[1])();
  auVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x28))
                     ((long *)CONCAT44(extraout_var_00,iVar2),e);
  for (local_88 = 0; global_dofs._M_ptr = auVar8._8_8_, i = auVar8._0_8_,
      IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         &local_dofs.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                          m_storage.m_cols), (long)local_88 < IVar4; local_88 = local_88 + 1) {
    peVar5 = std::span<const_long,_18446744073709551615UL>::operator[]
                       ((span<const_long,_18446744073709551615UL> *)&i,local_88);
    pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &this->dof_vector_,*peVar5);
    dVar1 = *pdVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_50,
                        local_88);
    auVar8._8_8_ = global_dofs._M_ptr;
    auVar8._0_8_ = i;
    *pSVar7 = dVar1;
  }
  temp._31_1_ = 0;
  __n = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                  (&local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  std::allocator<double>::allocator((allocator<double> *)&temp.field_0x1e);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,__n,(allocator_type *)&temp.field_0x1e);
  std::allocator<double>::~allocator((allocator<double> *)&temp.field_0x1e);
  dataPtr = std::vector<double,_std::allocator<double>_>::data(__return_storage_ptr__);
  IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    (&local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  Eigen::Stride<0,_0>::Stride(&local_b2);
  Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> *)local_b0,
             dataPtr,1,IVar4,&local_b2);
  local_c8 = Eigen::MatrixBase<Eigen::Matrix<double,1,-1,1,1,-1>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)local_50,
                        (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                        &local_dofs.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                         m_storage.m_cols);
  Eigen::Map<Eigen::Matrix<double,1,-1,1,1,-1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::Stride<0,0>> *)local_b0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&local_c8);
  temp._31_1_ = 1;
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_50);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &local_dofs.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
              m_cols);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Scalar> operator()(const lf::mesh::Entity& e,
                                 const Eigen::MatrixXd& local) const {
    // Obtain values of all shape functions in the evaluation points
    auto sf_eval =
        fe_space_->ShapeFunctionLayout(e)->EvalReferenceShapeFunctions(local);
    // Extract the d.o.f.s for the current entity from the vector of global
    // d.o.f. values
    Eigen::Matrix<SCALAR_COEFF, 1, Eigen::Dynamic> local_dofs(1,
                                                              sf_eval.rows());
    auto global_dofs = fe_space_->LocGlobMap().GlobalDofIndices(e);
    for (Eigen::Index i = 0; i < sf_eval.rows(); ++i) {
      local_dofs(i) = dof_vector_(global_dofs[i]);
    }
    // Trick to combine Eigen data types with STL containers
    std::vector<Scalar> result(local.cols());
    Eigen::Map<Eigen::Matrix<Scalar, 1, Eigen::Dynamic>> temp(result.data(), 1,
                                                              local.cols());
    temp = local_dofs * sf_eval;
    return result;
  }